

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O1

cmCMakePath * __thiscall
cmCMakePath::Absolute(cmCMakePath *__return_storage_ptr__,cmCMakePath *this,path *base)

{
  char cVar1;
  path path;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  path local_48;
  
  cVar1 = std::filesystem::__cxx11::path::has_root_directory();
  if (cVar1 == '\0') {
    std::filesystem::__cxx11::path::path(&local_48,base);
    std::filesystem::__cxx11::path::operator/=(&local_48,&this->Path);
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_68,&local_48,&local_69);
    cmCMakePath<std::__cxx11::string,cmCMakePath&>(__return_storage_ptr__,&local_68,generic_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_48);
  }
  else {
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->Path,&this->Path);
  }
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath cmCMakePath::Absolute(const cm::filesystem::path& base) const
{
  if (this->Path.is_relative()) {
    auto path = base;
    path /= this->Path;
    // filesystem::path::operator/= use preferred_separator ('\' on Windows)
    // so converts back to '/'
    return path.generic_string();
  }
  return *this;
}